

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode __thiscall
o3dgc::CompressedTriangleFans::SaveIntACEGC
          (CompressedTriangleFans *this,Vector<long> *data,unsigned_long M,BinaryStream *bstream)

{
  uint uVar1;
  unsigned_long position;
  unsigned_long uVar2;
  long *plVar3;
  unsigned_long *puVar4;
  uchar *puVar5;
  ulong local_100;
  unsigned_long i_2;
  unsigned_long encodedBytes;
  unsigned_long i_1;
  unsigned_long value;
  Adaptive_Bit_Model bModel1;
  Static_Bit_Model bModel0;
  Adaptive_Data_Model mModelValues;
  undefined1 local_80 [8];
  Arithmetic_Codec ace;
  unsigned_long i;
  long minValue;
  unsigned_long size;
  uint NMAX;
  unsigned_long start;
  BinaryStream *bstream_local;
  unsigned_long M_local;
  Vector<long> *data_local;
  CompressedTriangleFans *this_local;
  
  position = BinaryStream::GetSize(bstream);
  uVar2 = Vector<long>::GetSize(data);
  uVar1 = (int)(uVar2 << 3) + 100;
  uVar2 = Vector<long>::GetSize(data);
  i = 0;
  BinaryStream::WriteUInt32Bin(bstream,0);
  BinaryStream::WriteUInt32Bin(bstream,uVar2);
  if (uVar2 != 0) {
    ace.mode = 0;
    ace._44_4_ = 0;
    for (; (ulong)ace._40_8_ < uVar2; ace._40_8_ = ace._40_8_ + 1) {
      plVar3 = Vector<long>::operator[](data,ace._40_8_);
      if (*plVar3 < (long)i) {
        puVar4 = (unsigned_long *)Vector<long>::operator[](data,ace._40_8_);
        i = *puVar4;
      }
    }
    BinaryStream::WriteUInt32Bin(bstream,i + 0x7fffffff);
    if (this->m_sizeBufferAC < (ulong)uVar1) {
      if (this->m_bufferAC != (uchar *)0x0) {
        operator_delete__(this->m_bufferAC);
      }
      this->m_sizeBufferAC = (ulong)uVar1;
      puVar5 = (uchar *)operator_new__(this->m_sizeBufferAC);
      this->m_bufferAC = puVar5;
    }
    Arithmetic_Codec::Arithmetic_Codec((Arithmetic_Codec *)local_80);
    Arithmetic_Codec::set_buffer((Arithmetic_Codec *)local_80,uVar1,this->m_bufferAC);
    Arithmetic_Codec::start_encoder((Arithmetic_Codec *)local_80);
    bstream_local._0_4_ = (uint)M;
    Adaptive_Data_Model::Adaptive_Data_Model
              ((Adaptive_Data_Model *)&bModel1.bit_count,(uint)bstream_local + 2);
    Static_Bit_Model::Static_Bit_Model((Static_Bit_Model *)&bModel1.bit_0_count);
    Adaptive_Bit_Model::Adaptive_Bit_Model((Adaptive_Bit_Model *)&value);
    for (encodedBytes = 0; encodedBytes < uVar2; encodedBytes = encodedBytes + 1) {
      plVar3 = Vector<long>::operator[](data,encodedBytes);
      i_1._0_4_ = (uint)(*plVar3 - i);
      if (*plVar3 - i < M) {
        Arithmetic_Codec::encode
                  ((Arithmetic_Codec *)local_80,(uint)i_1,(Adaptive_Data_Model *)&bModel1.bit_count)
        ;
      }
      else {
        Arithmetic_Codec::encode
                  ((Arithmetic_Codec *)local_80,(uint)bstream_local,
                   (Adaptive_Data_Model *)&bModel1.bit_count);
        Arithmetic_Codec::ExpGolombEncode
                  ((Arithmetic_Codec *)local_80,(uint)i_1 - (uint)bstream_local,0,
                   (Static_Bit_Model *)&bModel1.bit_0_count,(Adaptive_Bit_Model *)&value);
      }
    }
    uVar1 = Arithmetic_Codec::stop_encoder((Arithmetic_Codec *)local_80);
    for (local_100 = 0; local_100 < uVar1; local_100 = local_100 + 1) {
      BinaryStream::WriteUChar8Bin(bstream,this->m_bufferAC[local_100]);
    }
    Adaptive_Data_Model::~Adaptive_Data_Model((Adaptive_Data_Model *)&bModel1.bit_count);
    Arithmetic_Codec::~Arithmetic_Codec((Arithmetic_Codec *)local_80);
  }
  uVar2 = BinaryStream::GetSize(bstream);
  BinaryStream::WriteUInt32Bin(bstream,position,uVar2 - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    CompressedTriangleFans::SaveIntACEGC(const Vector<long> & data,
                                                            const unsigned long M,
                                                            BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        const unsigned int NMAX = data.GetSize() * 8 + 100;
        const unsigned long size       = data.GetSize();
        long minValue = 0;
        bstream.WriteUInt32Bin(0);
        bstream.WriteUInt32Bin(size);
        if (size > 0)
        {
#ifdef DEBUG_VERBOSE
            printf("-----------\nsize %i, start %i\n", size, start);
            fprintf(g_fileDebugTF, "-----------\nsize %i, start %i\n", size, start);
#endif //DEBUG_VERBOSE
            for(unsigned long i = 0; i < size; ++i)
            {
                if (minValue > data[i]) 
                {
                    minValue = data[i];
                }
#ifdef DEBUG_VERBOSE
                printf("%i\t%i\n", i, data[i]);
                fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
#endif //DEBUG_VERBOSE
            }
            bstream.WriteUInt32Bin(minValue + O3DGC_MAX_LONG);
            if ( m_sizeBufferAC < NMAX )
            {
                delete [] m_bufferAC;
                m_sizeBufferAC = NMAX;
                m_bufferAC     = new unsigned char [m_sizeBufferAC];
            }
            Arithmetic_Codec ace;
            ace.set_buffer(NMAX, m_bufferAC);
            ace.start_encoder();
            Adaptive_Data_Model mModelValues(M+2);
            Static_Bit_Model bModel0;
            Adaptive_Bit_Model bModel1;
            unsigned long value;
            for(unsigned long i = 0; i < size; ++i)
            {
                value = data[i]-minValue;
                if (value < M) 
                {
                    ace.encode(value, mModelValues);
                }
                else 
                {
                    ace.encode(M, mModelValues);
                    ace.ExpGolombEncode(value-M, 0, bModel0, bModel1);
                }
            }
            unsigned long encodedBytes = ace.stop_encoder();
            for(unsigned long i = 0; i < encodedBytes; ++i)
            {
                bstream.WriteUChar8Bin(m_bufferAC[i]);
            }
        }
        bstream.WriteUInt32Bin(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }